

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  Action *pAVar1;
  undefined1 auVar2 [8];
  Result RVar3;
  TokenType TVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Token local_1f8;
  Token local_1a8;
  Var local_158;
  Var local_110;
  undefined1 auStack_c8 [8];
  Location loc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 auStack_88 [8];
  unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> action;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [39];
  allocator_type local_31;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)auStack_88,this);
  loc.filename.size_ = local_78;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)uStack_70;
  auStack_c8 = auStack_88;
  loc.filename.data_ =
       (char *)action._M_t.
               super___uniq_ptr_impl<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::InvokeAction_*,_std::default_delete<wabt::InvokeAction>_>
               .super__Head_base<0UL,_wabt::InvokeAction_*,_false>._M_head_impl;
  Token::~Token((Token *)auStack_88);
  TVar4 = Peek(this,0);
  if (TVar4 == Get) {
    Consume(&local_1a8,this);
    Token::~Token(&local_1a8);
    MakeUnique<wabt::GetAction,wabt::Location&>((wabt *)auStack_88,(Location *)auStack_c8);
    auVar2 = auStack_88;
    Var::Var(&local_110,this->last_module_index_,(Location *)auStack_c8);
    ParseVarOpt(this,(Var *)((long)auVar2 + 0x28),&local_110);
    Var::~Var(&local_110);
    RVar3 = ParseQuotedText(this,(string *)((long)auStack_88 + 0x70));
    auVar2 = auStack_88;
    if (RVar3.enum_ != Error) {
      auStack_88 = (undefined1  [8])0x0;
      pAVar1 = (out_action->_M_t).
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
      super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)auVar2;
      if (pAVar1 != (Action *)0x0) {
        (*pAVar1->_vptr_Action[1])();
      }
    }
    if (auStack_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_88 + 8))();
    }
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
  }
  else {
    if (TVar4 != Invoke) {
      auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_88,"invoke","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"get","");
      __l._M_len = 2;
      __l._M_array = (iterator)auStack_88;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_a0,__l,&local_31);
      RVar3 = ErrorExpected(this,&local_a0,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a0);
      lVar5 = 0;
      do {
        if (local_58 + lVar5 != *(undefined1 **)((long)local_68 + lVar5)) {
          operator_delete(*(undefined1 **)((long)local_68 + lVar5));
        }
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x40);
      return (Result)RVar3.enum_;
    }
    Consume(&local_1f8,this);
    Token::~Token(&local_1f8);
    MakeUnique<wabt::InvokeAction,wabt::Location&>((wabt *)auStack_88,(Location *)auStack_c8);
    auVar2 = auStack_88;
    Var::Var(&local_158,this->last_module_index_,(Location *)auStack_c8);
    ParseVarOpt(this,(Var *)((long)auVar2 + 0x28),&local_158);
    Var::~Var(&local_158);
    RVar3 = ParseQuotedText(this,(string *)((long)auStack_88 + 0x70));
    if ((RVar3.enum_ == Error) ||
       (RVar3 = ParseConstList(this,(ConstVector *)((long)auStack_88 + 0x98)), auVar2 = auStack_88,
       RVar3.enum_ == Error)) {
      if (auStack_88 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_88 + 8))();
      }
      return (Result)Error;
    }
    auStack_88 = (undefined1  [8])0x0;
    pAVar1 = (out_action->_M_t).
             super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
             super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
    (out_action->_M_t).super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
    super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl = (Action *)auVar2;
    if (pAVar1 != (Action *)0x0) {
      (*pAVar1->_vptr_Action[1])();
    }
    if (auStack_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_88 + 8))();
    }
  }
  RVar3 = Expect(this,Rpar);
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = MakeUnique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = MakeUnique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}